

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricDistributionPoint::~IfcElectricDistributionPoint
          (IfcElectricDistributionPoint *this)

{
  IfcElement *this_00;
  long *plVar1;
  long *plVar2;
  
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x80 = 0x8b38b8;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x68 = 0x8b3a20;
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.field_0x108 = 0x8b38e0;
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.field_0x118 = 0x8b3908;
  *(undefined8 *)
   &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.super_IfcDistributionElement.
    field_0x150 = 0x8b3930;
  *(undefined8 *)&this[-1].field_0x180 = 0x8b3958;
  *(undefined8 *)&this[-1].UserDefinedFunction.have = 0x8b3980;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x8b39a8;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject = 0x8b39d0;
  *(undefined8 *)
   &(this->super_IfcFlowController).super_IfcDistributionFlowElement.super_IfcDistributionElement.
    super_IfcElement.super_IfcProduct.super_IfcObject.field_0x10 = 0x8b39f8;
  plVar2 = *(long **)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                      super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject
                      .field_0x40;
  plVar1 = (long *)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                    super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x50;
  if (plVar2 != plVar1) {
    operator_delete(plVar2,*plVar1 + 1);
  }
  this_00 = (IfcElement *)
            &this[-1].super_IfcFlowController.super_IfcDistributionFlowElement.
             super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject.
             field_0x80;
  plVar1 = *(long **)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                      super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject
                      .field_0x20;
  plVar2 = (long *)&(this->super_IfcFlowController).super_IfcDistributionFlowElement.
                    super_IfcDistributionElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x30;
  if (plVar1 != plVar2) {
    operator_delete(plVar1,*plVar2 + 1);
  }
  IfcElement::~IfcElement(this_00,&PTR_construction_vtable_24__008b3a50);
  operator_delete(this_00,0x1d8);
  return;
}

Assistant:

IfcElectricDistributionPoint() : Object("IfcElectricDistributionPoint") {}